

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.h
# Opt level: O1

void __thiscall mvm::ip::increment(ip *this,uintptr_t inc)

{
  undefined8 *puVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (!CARRY8(inc,this->m_val)) {
    this->m_val = inc + this->m_val;
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,"[-][mvm] bytecode overflow","");
  *puVar1 = &PTR__mexcept_00184098;
  *(undefined2 *)(puVar1 + 1) = 6;
  __cxa_throw(puVar1,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

void increment(uintptr_t inc) {
    if (m_val > (std::numeric_limits<uintptr_t>::max() - inc)) {
      throw mexcept{"[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW};
    }

    m_val += inc;
    LOG_INFO("ip -> update ip, (base, val) = (" << m_base << "," << m_val
                                                << ")");
  }